

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O2

MetadataResult ExitProcess(ShellState *state,char **azArg,idx_t nArg)

{
  return 1 < nArg | EXIT;
}

Assistant:

MetadataResult ExitProcess(ShellState &state, const char **azArg, idx_t nArg) {
	if (nArg >= 2) {
		return MetadataResult::PRINT_USAGE;
	}
	int rc = 0;
	if (nArg > 1 && (rc = (int)integerValue(azArg[1])) != 0) {
		// exit immediately if a custom error code is provided
		exit(rc);
	}
	return MetadataResult::EXIT;
}